

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  bool bVar1;
  type_conflict5 tVar2;
  bool bVar3;
  int iVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  SPxId *pSVar7;
  Status *pSVar8;
  ulong *puVar9;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RCX;
  undefined8 in_RDX;
  int *piVar10;
  undefined8 in_RSI;
  long in_RDI;
  int in_stack_00000008;
  int in_stack_00000010;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *uend;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *uval;
  int *l_idx;
  int *last;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *upd;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *low;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *up;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mabs;
  bool enterrowrep;
  bool leaving;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  l;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  u;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  max;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int sel;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_24;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_22;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_16;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_14;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_23;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_20;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_15;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_21;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_19;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_17;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  undefined4 in_stack_ffffffffffffe1c8;
  int in_stack_ffffffffffffe1cc;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe1d8;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe1e0;
  type_conflict5 local_1e01;
  cpp_dec_float<200U,_int,_void> *local_1df8;
  bool local_1dc5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1dc4;
  undefined1 local_1d44 [36];
  double in_stack_ffffffffffffe2e0;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffe2e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1cc4;
  undefined1 local_1c44 [128];
  undefined4 local_1bc4;
  undefined1 local_1bc0 [128];
  ulong local_1b40;
  undefined1 local_1b34 [128];
  undefined1 local_1ab4 [128];
  undefined1 local_1a34 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_19b4;
  undefined1 local_1934 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_18b4;
  undefined1 local_1834 [128];
  undefined1 local_17b4 [128];
  undefined4 local_1734;
  undefined1 local_1730 [128];
  undefined1 local_16b0 [256];
  SPxColId local_15b0;
  undefined8 local_15a8 [17];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1520;
  undefined1 local_14a0 [128];
  undefined8 local_1420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1418;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1410;
  int *local_1408;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13fc;
  undefined1 local_137c [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12fc;
  undefined1 local_127c [128];
  undefined4 local_11fc;
  undefined1 local_11f8 [128];
  ulong local_1178;
  undefined1 local_116c [128];
  undefined1 local_10ec [128];
  undefined1 local_106c [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fec;
  undefined1 local_f6c [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_eec;
  undefined1 local_e6c [128];
  undefined1 local_dec [128];
  undefined4 local_d6c;
  undefined1 local_d68 [128];
  undefined1 local_ce8 [256];
  SPxColId local_be8;
  int *local_be0;
  int *local_bd8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bd0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bc0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bb8;
  cpp_dec_float<200U,_int,_void> local_bac;
  bool local_b2a;
  byte local_b29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_aa8;
  undefined1 local_a28 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9a8;
  cpp_dec_float<200U,_int,_void> local_928;
  int local_8a8;
  int local_8a4;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_870;
  undefined8 local_868;
  undefined1 *local_860;
  undefined8 local_858;
  ulong *local_850;
  undefined1 *local_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined1 *local_830;
  undefined8 local_828;
  ulong *local_820;
  undefined1 *local_818;
  cpp_dec_float<200U,_int,_void> *local_810;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_808;
  undefined1 *local_800;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7f0;
  undefined8 local_7e8;
  cpp_dec_float<200U,_int,_void> *local_7e0;
  cpp_dec_float<200U,_int,_void> *local_7d8;
  undefined1 *local_7d0;
  cpp_dec_float<200U,_int,_void> *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  cpp_dec_float<200U,_int,_void> *local_7b0;
  undefined1 *local_7a8;
  cpp_dec_float<200U,_int,_void> *local_7a0;
  undefined1 *local_798;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_790;
  undefined1 *local_788;
  cpp_dec_float<200U,_int,_void> *local_780;
  undefined1 *local_778;
  cpp_dec_float<200U,_int,_void> *local_770;
  undefined1 *local_768;
  cpp_dec_float<200U,_int,_void> *local_760;
  undefined1 *local_758;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_750;
  undefined1 *local_748;
  cpp_dec_float<200U,_int,_void> *local_740;
  undefined1 *local_738;
  cpp_dec_float<200U,_int,_void> *local_730;
  undefined1 *local_728;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_720;
  undefined1 *local_718;
  cpp_dec_float<200U,_int,_void> *local_710;
  undefined1 *local_708;
  cpp_dec_float<200U,_int,_void> *local_700;
  undefined1 *local_6f8;
  cpp_dec_float<200U,_int,_void> *local_6f0;
  undefined1 *local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e0;
  cpp_dec_float<200U,_int,_void> *local_6d8;
  undefined8 local_6d0;
  undefined1 *local_6c8;
  undefined8 local_6c0;
  cpp_dec_float<200U,_int,_void> *local_6b8;
  undefined1 *local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6a0;
  cpp_dec_float<200U,_int,_void> *local_698;
  undefined1 *local_690;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_688;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_680;
  cpp_dec_float<200U,_int,_void> *local_678;
  cpp_dec_float<200U,_int,_void> *local_670;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_668;
  cpp_dec_float<200U,_int,_void> *local_660;
  cpp_dec_float<200U,_int,_void> *local_658;
  undefined1 *local_650;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_648;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_640;
  cpp_dec_float<200U,_int,_void> *local_638;
  undefined1 *local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_628;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_620;
  cpp_dec_float<200U,_int,_void> *local_618;
  cpp_dec_float<200U,_int,_void> *local_610;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_608;
  cpp_dec_float<200U,_int,_void> *local_600;
  undefined8 local_5f8;
  undefined1 *local_5f0;
  ulong *local_5e8;
  undefined8 local_5e0;
  ulong *local_5d8;
  undefined8 local_5d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_5c1;
  cpp_dec_float<200U,_int,_void> *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  cpp_dec_float<200U,_int,_void> *local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_598;
  undefined1 *local_590;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_581;
  cpp_dec_float<200U,_int,_void> *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  cpp_dec_float<200U,_int,_void> *local_560;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  undefined1 *local_550;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_541;
  cpp_dec_float<200U,_int,_void> *local_540;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  cpp_dec_float<200U,_int,_void> *local_520;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_518;
  undefined1 *local_510;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_501;
  cpp_dec_float<200U,_int,_void> *local_500;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  cpp_dec_float<200U,_int,_void> *local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d8;
  undefined1 *local_4d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_4c1;
  cpp_dec_float<200U,_int,_void> *local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  cpp_dec_float<200U,_int,_void> *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  undefined1 *local_490;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_481;
  cpp_dec_float<200U,_int,_void> *local_480;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  cpp_dec_float<200U,_int,_void> *local_460;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  undefined1 *local_450;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_441;
  cpp_dec_float<200U,_int,_void> *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  cpp_dec_float<200U,_int,_void> *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined1 *local_410;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_401;
  cpp_dec_float<200U,_int,_void> *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  cpp_dec_float<200U,_int,_void> *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  undefined8 *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  undefined8 *local_3b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_369;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  undefined1 *local_338;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_329;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  undefined1 *local_2f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_269;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_229;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  cpp_dec_float<200U,_int,_void> *local_178;
  undefined1 *local_170;
  cpp_dec_float<200U,_int,_void> *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_149;
  cpp_dec_float<200U,_int,_void> *local_148;
  undefined1 *local_140;
  cpp_dec_float<200U,_int,_void> *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  cpp_dec_float<200U,_int,_void> *local_88;
  undefined1 *local_80;
  cpp_dec_float<200U,_int,_void> *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  cpp_dec_float<200U,_int,_void> *local_58;
  undefined1 *local_50;
  cpp_dec_float<200U,_int,_void> *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_810 = &local_928;
  local_890 = in_RCX;
  local_888 = in_RDX;
  local_880 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
  local_808 = &local_9a8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
  local_800 = local_a28;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
  local_7f8 = &local_aa8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
  local_7f0 = &local_b28;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
  local_b29 = *(int *)(in_RDI + 0x18) == 1;
  local_1dc5 = false;
  if (!(bool)local_b29) {
    local_1dc5 = *(int *)(*(long *)(in_RDI + 8) + 0x5b0) == -1;
  }
  local_b2a = local_1dc5;
  local_7e0 = &local_bac;
  local_7e8 = local_888;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
  local_bb8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x78e71e);
  local_bc0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x78e733);
  local_bc8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x78e748);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::delta(local_890);
  local_bd0 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::values((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x78e765);
  pSVar5 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::delta(local_890);
  local_bd8 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::indexMem(pSVar5);
  local_8a8 = -1;
  local_5f0 = local_a28;
  local_5f8 = local_880;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
  pSVar5 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::delta(local_890);
  bVar1 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::isSetup(pSVar5);
  piVar10 = local_bd8;
  if (bVar1) {
    UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::delta(local_890);
    iVar4 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x78e80a);
    local_be0 = piVar10 + iVar4;
    for (local_bd8 = local_bd8 + in_stack_00000008; local_bd8 < local_be0;
        local_bd8 = local_bd8 + in_stack_00000010) {
      local_8a4 = *local_bd8;
      if (((local_b29 & 1) == 0) ||
         ((((*(byte *)(in_RDI + 0x230) & 1) == 0 ||
           (bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::isCoBasic(in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc), !bVar1)) &&
          (((*(byte *)(in_RDI + 0x230) & 1) != 0 ||
           (bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::isBasic(in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc), !bVar1)))))) {
        bVar1 = false;
        if ((local_b2a & 1U) != 0) {
          pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc);
          bVar3 = SPxId::isSPxColId(pSVar7);
          bVar1 = false;
          if (bVar3) {
            SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(*(long *)(in_RDI + 8) + 0x238));
            pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc);
            SPxColId::SPxColId(&local_be8,pSVar7);
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::number(&in_stack_ffffffffffffe1d0->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,(SPxColId *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
            pSVar8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::Desc::colStatus((Desc *)in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc);
            bVar1 = *pSVar8 == P_FIXED;
          }
        }
        if (!bVar1) {
          local_608 = local_bd0 + local_8a4;
          local_600 = &local_928;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
          epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x78ea05);
          if (tVar2) {
            tVar2 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x78ea23);
            if (tVar2) {
              local_1df8 = &local_928;
            }
            else {
              local_1df8 = &local_bac;
            }
            local_610 = &local_bac;
            local_618 = local_1df8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
            local_628 = local_bb8 + local_8a4;
            local_620 = &local_aa8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
            local_868 = infinity();
            local_860 = local_ce8;
            local_870 = 0;
            local_5d0 = local_868;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (in_stack_ffffffffffffe1e0,(double)in_stack_ffffffffffffe1d8,
                       in_stack_ffffffffffffe1d0);
            tVar2 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x78eb28);
            if (tVar2) {
              local_268 = local_bc8 + local_8a4;
              local_258 = local_d68;
              local_260 = &local_aa8;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_269,local_260,local_268);
              local_250 = local_d68;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
              local_238 = local_d68;
              local_240 = local_260;
              local_248 = local_268;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                         (cpp_dec_float<200U,_int,_void> *)0x78ebf7);
              local_6e0 = &local_9a8;
              local_6e8 = local_d68;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              local_d6c = 0;
              tVar2 = boost::multiprecision::operator<=
                                (in_stack_ffffffffffffe1d8,(int *)in_stack_ffffffffffffe1d0);
              if (tVar2) {
                local_3f8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(in_RDI + 0x1b0);
                local_3f0 = local_dec;
                local_400 = &local_928;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_401,local_3f8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_400);
                local_3e8 = local_dec;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                local_3d0 = local_dec;
                local_3d8 = local_3f8;
                local_3e0 = local_400;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                           (cpp_dec_float<200U,_int,_void> *)0x78ed0f);
                local_6f0 = &local_928;
                local_6f8 = local_dec;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              }
              else {
                local_1e8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(in_RDI + 0x1b0);
                local_1d8 = &local_eec;
                local_1e0 = &local_9a8;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1e9,local_1e0,local_1e8);
                local_1d0 = &local_eec;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                local_1b8 = &local_eec;
                local_1c0 = local_1e0;
                local_1c8 = local_1e8;
                boost::multiprecision::default_ops::
                eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                           (cpp_dec_float<200U,_int,_void> *)0x78ee03);
                local_430 = local_e6c;
                local_438 = &local_eec;
                local_440 = &local_928;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_441,local_438,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_440);
                local_428 = local_e6c;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                local_410 = local_e6c;
                local_418 = local_438;
                local_420 = local_440;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                           (cpp_dec_float<200U,_int,_void> *)0x78eeba);
                local_700 = &local_928;
                local_708 = local_e6c;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              }
              tVar2 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x78ef04);
              if (tVar2) {
                local_630 = local_a28;
                local_638 = &local_928;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                local_8a8 = local_8a4;
              }
            }
          }
          else {
            epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
            local_20 = local_f6c;
            local_28 = &local_fec;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_29,local_28);
            local_10 = local_f6c;
            local_18 = local_28;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
            local_8 = local_f6c;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
            tVar2 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x78f002);
            if (tVar2) {
              local_50 = local_10ec;
              local_58 = &local_928;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_59,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_58);
              local_40 = local_10ec;
              local_48 = local_58;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              local_38 = local_10ec;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
              tVar2 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x78f0a7);
              if (tVar2) {
                local_80 = local_106c;
                local_88 = &local_928;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_89,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_88);
                local_70 = local_106c;
                local_78 = local_88;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                local_68 = local_106c;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
              }
              else {
                local_7d0 = local_106c;
                local_7d8 = &local_bac;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              }
              local_710 = &local_bac;
              local_718 = local_106c;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              local_648 = local_bc0 + local_8a4;
              local_640 = &local_b28;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              puVar9 = (ulong *)infinity();
              local_1178 = *puVar9 ^ 0x8000000000000000;
              local_848 = local_116c;
              local_850 = &local_1178;
              local_858 = 0;
              local_5d8 = local_850;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (in_stack_ffffffffffffe1e0,(double)in_stack_ffffffffffffe1d8,
                         in_stack_ffffffffffffe1d0);
              tVar2 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x78f27e);
              if (tVar2) {
                local_2a8 = local_bc8 + local_8a4;
                local_298 = local_11f8;
                local_2a0 = &local_b28;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_2a9,local_2a0,local_2a8);
                local_290 = local_11f8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                local_278 = local_11f8;
                local_280 = local_2a0;
                local_288 = local_2a8;
                boost::multiprecision::default_ops::
                eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                           (cpp_dec_float<200U,_int,_void> *)0x78f34d);
                local_720 = &local_9a8;
                local_728 = local_11f8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                local_11fc = 0;
                tVar2 = boost::multiprecision::operator>=
                                  (in_stack_ffffffffffffe1d8,(int *)in_stack_ffffffffffffe1d0);
                if (tVar2) {
                  local_b8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(in_RDI + 0x1b0);
                  local_b0 = &local_12fc;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_b9,local_b8);
                  local_a0 = &local_12fc;
                  local_a8 = local_b8;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  local_98 = &local_12fc;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                  local_470 = local_127c;
                  local_478 = &local_12fc;
                  local_480 = &local_928;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_481,local_478,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_480);
                  local_468 = local_127c;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                  local_450 = local_127c;
                  local_458 = local_478;
                  local_460 = local_480;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                             (cpp_dec_float<200U,_int,_void> *)0x78f4ec);
                  local_730 = &local_928;
                  local_738 = local_127c;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                }
                else {
                  local_2e8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)(in_RDI + 0x1b0);
                  local_2d8 = &local_13fc;
                  local_2e0 = &local_9a8;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_2e9,local_2e0,local_2e8);
                  local_2d0 = &local_13fc;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                  local_2b8 = &local_13fc;
                  local_2c0 = local_2e0;
                  local_2c8 = local_2e8;
                  boost::multiprecision::default_ops::
                  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                             (cpp_dec_float<200U,_int,_void> *)0x78f5e0);
                  local_4b0 = local_137c;
                  local_4b8 = &local_13fc;
                  local_4c0 = &local_928;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_4c1,local_4b8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_4c0);
                  local_4a8 = local_137c;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                  local_490 = local_137c;
                  local_498 = local_4b8;
                  local_4a0 = local_4c0;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                             (cpp_dec_float<200U,_int,_void> *)0x78f697);
                  local_740 = &local_928;
                  local_748 = local_137c;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                }
                tVar2 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x78f6e1);
                if (tVar2) {
                  local_650 = local_a28;
                  local_658 = &local_928;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  local_8a8 = local_8a4;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::delta(local_890);
    local_1408 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::altIndexMem((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe1d0);
    UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::delta(local_890);
    pnVar6 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::altValues((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffe1d0);
    local_1410 = pnVar6;
    iVar4 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x78f7b1);
    local_1418 = pnVar6 + iVar4;
    local_8a4 = 0;
    for (; local_1410 < local_1418; local_1410 = local_1410 + 1) {
      local_660 = &local_928;
      local_668 = local_1410;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
      local_1420 = 0;
      tVar2 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                         (double *)0x78f841);
      if (tVar2) {
        epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
        local_e0 = local_14a0;
        local_e8 = &local_1520;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_e9,local_e8);
        local_d0 = local_14a0;
        local_d8 = local_e8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
        local_c8 = local_14a0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x78f8f8);
        local_1e01 = false;
        if (tVar2) {
          epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
          local_1e01 = boost::multiprecision::operator<=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                  (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x78f92e);
        }
        if (local_1e01 == false) {
          piVar10 = local_1408 + 1;
          *local_1408 = local_8a4;
          local_1408 = piVar10;
          if (((local_b29 & 1) == 0) ||
             ((((*(byte *)(in_RDI + 0x230) & 1) == 0 ||
               (bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::isCoBasic(in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc), !bVar1))
              && (((*(byte *)(in_RDI + 0x230) & 1) != 0 ||
                  (bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::isBasic(in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc), !bVar1)))
              ))) {
            bVar1 = false;
            if ((local_b2a & 1U) != 0) {
              pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc);
              bVar3 = SPxId::isSPxColId(pSVar7);
              bVar1 = false;
              if (bVar3) {
                SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(*(long *)(in_RDI + 8) + 0x238));
                pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc);
                SPxColId::SPxColId(&local_15b0,pSVar7);
                SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::number(&in_stack_ffffffffffffe1d0->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,(SPxColId *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8))
                ;
                pSVar8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::Desc::colStatus((Desc *)in_stack_ffffffffffffe1d0,
                                           in_stack_ffffffffffffe1cc);
                bVar1 = *pSVar8 == P_FIXED;
              }
            }
            if (!bVar1) {
              epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
              tVar2 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x78fb0c);
              if (tVar2) {
                tVar2 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x78fb2a);
                if (tVar2) {
                  in_stack_ffffffffffffe1e0 = &local_928;
                }
                else {
                  in_stack_ffffffffffffe1e0 = &local_bac;
                }
                local_670 = &local_bac;
                local_678 = in_stack_ffffffffffffe1e0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                local_688 = local_bb8 + local_8a4;
                local_680 = &local_aa8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                local_838 = infinity();
                local_830 = local_16b0;
                local_840 = 0;
                local_5e0 = local_838;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffe1e0,(double)in_stack_ffffffffffffe1d8,
                           in_stack_ffffffffffffe1d0);
                tVar2 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x78fc2f);
                if (tVar2) {
                  local_328 = local_bc8 + local_8a4;
                  local_318 = local_1730;
                  local_320 = &local_aa8;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_329,local_320,local_328);
                  local_310 = local_1730;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                  local_2f8 = local_1730;
                  local_300 = local_320;
                  local_308 = local_328;
                  boost::multiprecision::default_ops::
                  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                             (cpp_dec_float<200U,_int,_void> *)0x78fcfe);
                  local_750 = &local_9a8;
                  local_758 = local_1730;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  local_1734 = 0;
                  tVar2 = boost::multiprecision::operator<=
                                    (in_stack_ffffffffffffe1d8,(int *)in_stack_ffffffffffffe1d0);
                  if (tVar2) {
                    local_4f8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x1b0);
                    local_4f0 = local_17b4;
                    local_500 = &local_928;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_501,local_4f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_500);
                    local_4e8 = local_17b4;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                    local_4d0 = local_17b4;
                    local_4d8 = local_4f8;
                    local_4e0 = local_500;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                               (cpp_dec_float<200U,_int,_void> *)0x78fe16);
                    local_760 = &local_928;
                    local_768 = local_17b4;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  }
                  else {
                    local_228 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x1b0);
                    local_218 = &local_18b4;
                    local_220 = &local_9a8;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_229,local_220,local_228);
                    local_210 = &local_18b4;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                    local_1f8 = &local_18b4;
                    local_200 = local_220;
                    local_208 = local_228;
                    boost::multiprecision::default_ops::
                    eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                               (cpp_dec_float<200U,_int,_void> *)0x78ff0a);
                    local_530 = local_1834;
                    local_538 = &local_18b4;
                    local_540 = &local_928;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_541,local_538,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_540);
                    local_528 = local_1834;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                    local_510 = local_1834;
                    local_518 = local_538;
                    local_520 = local_540;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                               (cpp_dec_float<200U,_int,_void> *)0x78ffc1);
                    local_770 = &local_928;
                    local_778 = local_1834;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  }
                  tVar2 = boost::multiprecision::operator<
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8
                                                ),
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x79000b);
                  if (tVar2) {
                    local_690 = local_a28;
                    local_698 = &local_928;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                    local_8a8 = local_8a4;
                  }
                }
              }
              else {
                epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                local_110 = local_1934;
                local_118 = &local_19b4;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_119,local_118);
                local_100 = local_1934;
                local_108 = local_118;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                local_f8 = local_1934;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                          ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                tVar2 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x790109);
                if (tVar2) {
                  local_140 = local_1ab4;
                  local_148 = &local_928;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_149,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_148);
                  local_130 = local_1ab4;
                  local_138 = local_148;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  local_128 = local_1ab4;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                  tVar2 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8
                                                ),
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x7901ae);
                  if (tVar2) {
                    local_170 = local_1a34;
                    local_178 = &local_928;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_179,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_178);
                    local_160 = local_1a34;
                    local_168 = local_178;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                    local_158 = local_1a34;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                  }
                  else {
                    local_7c0 = local_1a34;
                    local_7c8 = &local_bac;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  }
                  local_780 = &local_bac;
                  local_788 = local_1a34;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  local_6a8 = local_bc0 + local_8a4;
                  local_6a0 = &local_b28;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                  puVar9 = (ulong *)infinity();
                  local_1b40 = *puVar9 ^ 0x8000000000000000;
                  local_818 = local_1b34;
                  local_820 = &local_1b40;
                  local_828 = 0;
                  local_5e8 = local_820;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffe1e0,(double)in_stack_ffffffffffffe1d8,
                             in_stack_ffffffffffffe1d0);
                  tVar2 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8
                                                ),
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x790385);
                  if (tVar2) {
                    local_368 = local_bc8 + local_8a4;
                    local_358 = local_1bc0;
                    local_360 = &local_b28;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_369,local_360,local_368);
                    local_350 = local_1bc0;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                    local_338 = local_1bc0;
                    local_340 = local_360;
                    local_348 = local_368;
                    boost::multiprecision::default_ops::
                    eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                               (cpp_dec_float<200U,_int,_void> *)0x790454);
                    local_790 = &local_9a8;
                    local_798 = local_1bc0;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                               (cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                    local_1bc4 = 0;
                    tVar2 = boost::multiprecision::operator>=
                                      (in_stack_ffffffffffffe1d8,(int *)in_stack_ffffffffffffe1d0);
                    if (tVar2) {
                      local_1a8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x1b0);
                      local_1a0 = &local_1cc4;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_1a9,local_1a8);
                      local_190 = &local_1cc4;
                      local_198 = local_1a8;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                                 (cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                      local_188 = &local_1cc4;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                      local_570 = local_1c44;
                      local_578 = &local_1cc4;
                      local_580 = &local_928;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_581,local_578,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_580);
                      local_568 = local_1c44;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                      local_550 = local_1c44;
                      local_558 = local_578;
                      local_560 = local_580;
                      boost::multiprecision::default_ops::
                      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                                 (cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                 (cpp_dec_float<200U,_int,_void> *)0x7905f3);
                      local_7a0 = &local_928;
                      local_7a8 = local_1c44;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                                 (cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                    }
                    else {
                      local_3a8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x1b0);
                      local_398 = &local_1dc4;
                      local_3a0 = &local_9a8;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_3a9,local_3a0,local_3a8);
                      local_390 = &local_1dc4;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                      local_378 = &local_1dc4;
                      local_380 = local_3a0;
                      local_388 = local_3a8;
                      boost::multiprecision::default_ops::
                      eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                                 (cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                 (cpp_dec_float<200U,_int,_void> *)0x7906de);
                      local_5b0 = local_1d44;
                      local_5b8 = &local_1dc4;
                      local_5c0 = &local_928;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_5c1,local_5b8,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_5c0);
                      local_5a8 = local_1d44;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0);
                      local_590 = local_1d44;
                      local_598 = local_5b8;
                      local_5a0 = local_5c0;
                      boost::multiprecision::default_ops::
                      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                                 (cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8),
                                 (cpp_dec_float<200U,_int,_void> *)0x790792);
                      local_7b0 = &local_928;
                      local_7b8 = local_1d44;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                                 (cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                    }
                    tVar2 = boost::multiprecision::operator<
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)CONCAT44(in_stack_ffffffffffffe1cc,
                                                   in_stack_ffffffffffffe1c8),
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)0x7907dc);
                    if (tVar2) {
                      local_6b0 = local_a28;
                      local_6b8 = &local_928;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                                ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
                                 (cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
                      local_8a8 = local_8a4;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_15a8[0] = 0;
          local_3c0 = local_1410;
          local_3c8 = local_15a8;
          local_3b8 = local_3c8;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    (in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
        }
      }
      local_8a4 = local_8a4 + 1;
    }
    in_stack_ffffffffffffe1d0 =
         (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::delta(local_890);
    pSVar5 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::delta(local_890);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::indexMem(pSVar5);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setSize((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_ffffffffffffe1d0,in_stack_ffffffffffffe1cc);
    pSVar5 = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::delta(local_890);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::forceSetup(pSVar5);
  }
  local_6c0 = local_880;
  local_6c8 = local_a28;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
  local_6d0 = local_888;
  local_6d8 = &local_bac;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffe1d0,
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe1cc,in_stack_ffffffffffffe1c8));
  return local_8a8;
}

Assistant:

int SPxFastRT<R>::maxDelta(
   R& val,                                /* on return: maximum step length */
   R& maxabs,                             /* on return: maximum absolute value in upd VectorBase<R> */
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         x = upd[i];

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse Vector update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;

            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;
   return sel;
}